

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O0

cmCommand * __thiscall cmFunctionHelperCommand::Clone(cmFunctionHelperCommand *this)

{
  cmFunctionHelperCommand *this_00;
  cmFunctionHelperCommand *newC;
  cmFunctionHelperCommand *this_local;
  
  this_00 = (cmFunctionHelperCommand *)operator_new(0xa0);
  cmFunctionHelperCommand(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this_00->Args,&this->Args);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
            (&this_00->Functions,&this->Functions);
  (this_00->Policies).Status.super__Base_bitset<4UL>._M_w[0] =
       (this->Policies).Status.super__Base_bitset<4UL>._M_w[0];
  (this_00->Policies).Status.super__Base_bitset<4UL>._M_w[1] =
       (this->Policies).Status.super__Base_bitset<4UL>._M_w[1];
  (this_00->Policies).Status.super__Base_bitset<4UL>._M_w[2] =
       (this->Policies).Status.super__Base_bitset<4UL>._M_w[2];
  (this_00->Policies).Status.super__Base_bitset<4UL>._M_w[3] =
       (this->Policies).Status.super__Base_bitset<4UL>._M_w[3];
  std::__cxx11::string::operator=((string *)&this_00->FilePath,(string *)&this->FilePath);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    cmFunctionHelperCommand* newC = new cmFunctionHelperCommand;
    // we must copy when we clone
    newC->Args = this->Args;
    newC->Functions = this->Functions;
    newC->Policies = this->Policies;
    newC->FilePath = this->FilePath;
    return newC;
  }